

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.cpp
# Opt level: O0

bool embree::os_init(bool hugepages,bool verbose)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  int iVar4;
  ostream *this;
  istream *piVar5;
  byte in_SIL;
  byte in_DIL;
  string unit;
  string val;
  string tag;
  stringstream sline;
  string line;
  ifstream file;
  int hugepagesize;
  Lock<embree::MutexSys> lock;
  MutexSys *in_stack_fffffffffffffb58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb60;
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  stringstream local_3e0 [392];
  string local_258 [48];
  istream local_228 [520];
  int local_20;
  int local_1c;
  byte local_3;
  byte local_2;
  byte local_1;
  
  local_2 = in_DIL & 1;
  local_3 = in_SIL & 1;
  Lock<embree::MutexSys>::Lock
            ((Lock<embree::MutexSys> *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  if ((local_2 & 1) == 0) {
    huge_pages_enabled = 0;
    local_1 = 1;
    local_1c = 1;
  }
  else {
    local_20 = 0;
    std::ifstream::ifstream(local_228);
    std::ifstream::open((char *)local_228,0x58007b);
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) == 0) {
      if ((local_3 & 1) != 0) {
        this = std::operator<<((ostream *)&std::cout,
                               "WARNING: Could not open /proc/meminfo. Huge page support cannot get enabled!"
                              );
        std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      }
      huge_pages_enabled = 0;
      local_1 = 0;
      local_1c = 1;
    }
    else {
      std::__cxx11::string::string(local_258);
      do {
        piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_228,local_258)
        ;
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
        if (!bVar2) break;
        _Var3 = std::operator|(_S_out,_S_in);
        std::__cxx11::stringstream::stringstream(local_3e0,local_258,_Var3);
        while( true ) {
          bVar1 = std::ios::eof();
          bVar2 = false;
          if ((bVar1 & 1) == 0) {
            iVar4 = std::istream::peek();
            bVar2 = iVar4 == 0x20;
          }
          if (!bVar2) break;
          std::istream::ignore();
        }
        std::__cxx11::string::string(local_400);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_3e0,local_400,' ');
        while( true ) {
          bVar1 = std::ios::eof();
          bVar2 = false;
          if ((bVar1 & 1) == 0) {
            iVar4 = std::istream::peek();
            bVar2 = iVar4 == 0x20;
          }
          if (!bVar2) break;
          std::istream::ignore();
        }
        std::__cxx11::string::string(local_420);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_3e0,local_420,' ');
        while( true ) {
          bVar1 = std::ios::eof();
          bVar2 = false;
          if ((bVar1 & 1) == 0) {
            iVar4 = std::istream::peek();
            bVar2 = iVar4 == 0x20;
          }
          if (!bVar2) break;
          std::istream::ignore();
        }
        std::__cxx11::string::string(local_440);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_3e0,local_440,' ');
        bVar2 = std::operator==(in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58);
        if ((bVar2) &&
           (bVar2 = std::operator==(in_stack_fffffffffffffb60,(char *)in_stack_fffffffffffffb58),
           bVar2)) {
          local_20 = std::__cxx11::stoi(in_stack_fffffffffffffb60,
                                        (size_t *)in_stack_fffffffffffffb58,0);
          local_20 = local_20 << 10;
          local_1c = 3;
        }
        else {
          local_1c = 0;
        }
        std::__cxx11::string::~string(local_440);
        std::__cxx11::string::~string(local_420);
        std::__cxx11::string::~string(local_400);
        std::__cxx11::stringstream::~stringstream(local_3e0);
      } while (local_1c == 0);
      if (local_20 == 0x200000) {
        huge_pages_enabled = 1;
        local_1 = 1;
      }
      else {
        if ((local_3 & 1) != 0) {
          in_stack_fffffffffffffb60 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::operator<<((ostream *)&std::cout,
                               "WARNING: Only 2MB huge pages supported. Huge page support cannot get enabled!"
                              );
          std::ostream::operator<<(in_stack_fffffffffffffb60,std::endl<char,std::char_traits<char>>)
          ;
        }
        huge_pages_enabled = 0;
        local_1 = 0;
      }
      local_1c = 1;
      std::__cxx11::string::~string(local_258);
    }
    std::ifstream::~ifstream(local_228);
  }
  Lock<embree::MutexSys>::~Lock((Lock<embree::MutexSys> *)in_stack_fffffffffffffb60);
  return (bool)(local_1 & 1);
}

Assistant:

bool os_init(bool hugepages, bool verbose) 
  {
    Lock<MutexSys> lock(os_init_mutex);

    if (!hugepages) {
      huge_pages_enabled = false;
      return true;
    }

#if defined(__LINUX__)

    int hugepagesize = 0;

    std::ifstream file; 
    file.open("/proc/meminfo",std::ios::in);
    if (!file.is_open()) {
      if (verbose) std::cout << "WARNING: Could not open /proc/meminfo. Huge page support cannot get enabled!" << std::endl;
      huge_pages_enabled = false;
      return false;
    }
    
    std::string line;
    while (getline(file,line))
    {
      std::stringstream sline(line);
      while (!sline.eof() && sline.peek() == ' ') sline.ignore();
      std::string tag; getline(sline,tag,' ');
      while (!sline.eof() && sline.peek() == ' ') sline.ignore();
      std::string val; getline(sline,val,' ');
      while (!sline.eof() && sline.peek() == ' ') sline.ignore();
      std::string unit; getline(sline,unit,' ');
      if (tag == "Hugepagesize:" && unit == "kB") {
	hugepagesize = std::stoi(val)*1024;
	break;
      }
    }
    
    if (hugepagesize != PAGE_SIZE_2M) 
    {
      if (verbose) std::cout << "WARNING: Only 2MB huge pages supported. Huge page support cannot get enabled!" << std::endl;
      huge_pages_enabled = false;
      return false;
    }
#endif

    huge_pages_enabled = true;
    return true;
  }